

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O0

void __thiscall embree::XML::~XML(XML *this)

{
  RefCount *in_RDI;
  vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *unaff_retaddr;
  
  in_RDI->_vptr_RefCount = (_func_int **)&PTR__XML_00601c40;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::~vector
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)unaff_retaddr);
  std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::~vector
            (unaff_retaddr);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x41c94c);
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  ParseLocation::~ParseLocation((ParseLocation *)0x41c968);
  RefCount::~RefCount(in_RDI);
  return;
}

Assistant:

XML (const std::string& name = "") : name(name) {}